

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Iterator __thiscall
Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData>::insert
          (Map<Callback::MemberFuncPtr,_Callback::Emitter::SignalData> *this,Item **cell,
          Item *parent,MemberFuncPtr *key,SignalData *value)

{
  Item *pIVar1;
  usize uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  ItemBlock *pIVar6;
  Item *pIVar7;
  ulong uVar8;
  long lVar9;
  Iterator *pIVar10;
  Item *pIVar11;
  
  while( true ) {
    if ((cell != &parent->right && (cell != &parent->left && parent != (Item *)0x0)) &&
       (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x188,"!parent || cell == &parent->left || cell == &parent->right"),
       iVar5 != 0)) goto LAB_00104cb7;
    pIVar11 = *cell;
    if (pIVar11 == (Item *)0x0) break;
    bVar4 = Callback::MemberFuncPtr::operator>(key,&pIVar11->key);
    lVar9 = 0x90;
    if (!bVar4) {
      bVar4 = Callback::MemberFuncPtr::operator<(key,&pIVar11->key);
      lVar9 = 0x88;
      if (!bVar4) {
        Callback::Emitter::SignalData::operator=(&pIVar11->value,value);
        return (Iterator)pIVar11;
      }
    }
    cell = (Item **)((long)&(pIVar11->key).ptr + lVar9);
    parent = pIVar11;
  }
  pIVar11 = this->freeItem;
  if (pIVar11 == (Item *)0x0) {
    pIVar6 = (ItemBlock *)operator_new__(0x2e8);
    pIVar6->next = this->blocks;
    this->blocks = pIVar6;
    pIVar11 = (Item *)0x0;
    for (uVar8 = 8; uVar8 < 0x2e8; uVar8 = uVar8 + 0xb8) {
      pIVar6[0x17].next = (ItemBlock *)pIVar11;
      pIVar11 = (Item *)(pIVar6 + 1);
      pIVar6 = pIVar6 + 0x17;
    }
    this->freeItem = pIVar11;
  }
  Item::Item(pIVar11,parent,key,value);
  this->freeItem = pIVar11->prev;
  *cell = pIVar11;
  this->_size = this->_size + 1;
  if (parent == (Item *)0x0) {
    pIVar7 = (this->_begin).item;
    if (pIVar7 != &this->endItem) {
      iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0x1a1,"_begin.item == &endItem");
      if (iVar5 != 0) {
LAB_00104cb7:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      pIVar7 = (this->_begin).item;
    }
    pIVar11->prev = (Item *)0x0;
    pIVar11->next = pIVar7;
    (this->_begin).item = pIVar11;
    (this->endItem).prev = pIVar11;
  }
  else {
    pIVar7 = parent;
    if (cell == &parent->right) {
      pIVar7 = parent->next;
    }
    pIVar1 = pIVar7->prev;
    pIVar10 = (Iterator *)&pIVar1->next;
    if (pIVar1 == (Item *)0x0) {
      pIVar10 = &this->_begin;
    }
    pIVar11->prev = pIVar1;
    pIVar10->item = pIVar11;
    pIVar11->next = pIVar7;
    pIVar7->prev = pIVar11;
    while( true ) {
      uVar2 = parent->height;
      Item::updateHeightAndSlope(parent);
      pIVar7 = rebal(this,parent);
      if (uVar2 == pIVar7->height) break;
      parent = pIVar7->parent;
      if (parent == (Item *)0x0) {
        return (Iterator)pIVar11;
      }
    }
  }
  return (Iterator)pIVar11;
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }